

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_createtable(lua_State *L,int narray,int nrec)

{
  StkId pSVar1;
  Table *x_;
  Table *t;
  
  t = luaH_new(L);
  pSVar1 = (L->top).p;
  *(Table **)pSVar1 = t;
  (pSVar1->val).tt_ = 'E';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if (0 < narray || 0 < nrec) {
    luaH_resize(L,t,narray,nrec);
  }
  if (0 < L->l_G->GCdebt) {
    return;
  }
  luaC_step(L);
  return;
}

Assistant:

LUA_API void lua_createtable (lua_State *L, int narray, int nrec) {
  Table *t;
  lua_lock(L);
  t = luaH_new(L);
  sethvalue2s(L, L->top.p, t);
  api_incr_top(L);
  if (narray > 0 || nrec > 0)
    luaH_resize(L, t, cast_uint(narray), cast_uint(nrec));
  luaC_checkGC(L);
  lua_unlock(L);
}